

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

idx_t __thiscall duckdb::Vector::GetAllocationSize(Vector *this,idx_t cardinality)

{
  PhysicalType type;
  pointer puVar1;
  idx_t iVar2;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar3;
  pointer this_00;
  long lVar4;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *child;
  long lVar5;
  pointer this_01;
  
  lVar4 = 0;
  while( true ) {
    while( true ) {
      type = (this->type).physical_type_;
      if (type != ARRAY) break;
      cardinality = ArrayVector::GetTotalSize(this);
      this = ArrayVector::GetEntryInternal<duckdb::Vector_const>(this);
    }
    if (type != LIST) break;
    iVar2 = GetTypeIdSize(LIST);
    lVar5 = iVar2 * cardinality;
    cardinality = ListVector::GetListCapacity(this);
    this = ListVector::GetEntryInternal<duckdb::Vector_const>(this);
    lVar4 = lVar4 + lVar5;
  }
  if (type == STRUCT) {
    pvVar3 = StructVector::GetEntries(this);
    puVar1 = (pvVar3->
             super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar5 = 0;
    for (this_01 = (pvVar3->
                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar1;
        this_01 = this_01 + 1) {
      this_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                          (this_01);
      iVar2 = GetAllocationSize(this_00,cardinality);
      lVar5 = lVar5 + iVar2;
    }
  }
  else {
    iVar2 = GetTypeIdSize(type);
    lVar5 = iVar2 * cardinality;
  }
  return lVar5 + lVar4;
}

Assistant:

idx_t Vector::GetAllocationSize(idx_t cardinality) const {
	if (!type.IsNested()) {
		auto physical_size = GetTypeIdSize(type.InternalType());
		return cardinality * physical_size;
	}
	auto internal_type = type.InternalType();
	switch (internal_type) {
	case PhysicalType::LIST: {
		auto physical_size = GetTypeIdSize(type.InternalType());
		auto total_size = physical_size * cardinality;

		auto child_cardinality = ListVector::GetListCapacity(*this);
		auto &child_entry = ListVector::GetEntry(*this);
		total_size += (child_entry.GetAllocationSize(child_cardinality));
		return total_size;
	}
	case PhysicalType::ARRAY: {
		auto child_cardinality = ArrayVector::GetTotalSize(*this);

		auto &child_entry = ArrayVector::GetEntry(*this);
		auto total_size = (child_entry.GetAllocationSize(child_cardinality));
		return total_size;
	}
	case PhysicalType::STRUCT: {
		idx_t total_size = 0;
		auto &children = StructVector::GetEntries(*this);
		for (auto &child : children) {
			total_size += child->GetAllocationSize(cardinality);
		}
		return total_size;
	}
	default:
		throw NotImplementedException("Vector::GetAllocationSize not implemented for type: %s", type.ToString());
		break;
	}
}